

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_connect(Curl_easy *data,_Bool *done)

{
  connectdata *conn_00;
  pingpong *pp;
  pop3_conn *pop3c;
  connectdata *conn;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  *done = false;
  Curl_conncontrol(conn_00,0);
  (conn_00->proto).smbc.send_buf = (char *)0x1d4c0;
  (conn_00->proto).ftpc.pp.statemachine = pop3_statemachine;
  (conn_00->proto).ftpc.pp.endofresp = pop3_endofresp;
  (conn_00->proto).pop3c.preftype = '\a';
  Curl_sasl_init((SASL *)&(conn_00->proto).imapc.sasl.authmechs,data,&saslpop3);
  Curl_pp_init(&(conn_00->proto).ftpc.pp);
  data_local._4_4_ = pop3_parse_url_options(conn_00);
  if (data_local._4_4_ == CURLE_OK) {
    pop3_state(data,POP3_SERVERGREET);
    data_local._4_4_ = pop3_multi_statemach(data,done);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode pop3_connect(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in POP3 */
  connkeep(conn, "POP3 default");

  PINGPONG_SETUP(pp, pop3_statemachine, pop3_endofresp);

  /* Set the default preferred authentication type and mechanism */
  pop3c->preftype = POP3_TYPE_ANY;
  Curl_sasl_init(&pop3c->sasl, data, &saslpop3);

  /* Initialise the pingpong layer */
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = pop3_parse_url_options(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  pop3_state(data, POP3_SERVERGREET);

  result = pop3_multi_statemach(data, done);

  return result;
}